

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O0

void __thiscall
datarate_test::anon_unknown_0::DatarateTestSVC::
BasicRateTargetingSVC3TL3SLExternalResizePattern1HighResTest(DatarateTestSVC *this)

{
  undefined6 uVar1;
  undefined1 uVar2;
  bool bVar3;
  __tuple_element_t<4UL,_tuple<const_CodecFactory_*,_TestMode,_int,_unsigned_int,_int>_> *p_Var4;
  uint uVar5;
  long *in_RDI;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  int bitrate_sl2;
  int bitrate_sl1;
  int bitrate_sl0;
  ResizingVideoSource_conflict video;
  int bitrate_array [2];
  int in_stack_ffffffffffffff60;
  undefined2 in_stack_ffffffffffffff64;
  undefined1 in_stack_ffffffffffffff66;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int iVar6;
  Type in_stack_ffffffffffffff8c;
  HasNewFatalFailureHelper *in_stack_ffffffffffffff90;
  undefined1 local_48 [32];
  Message *in_stack_ffffffffffffffd8;
  AssertHelper *in_stack_ffffffffffffffe0;
  undefined8 local_10 [2];
  
  *(undefined4 *)(in_RDI + 0x1a) = 500;
  *(undefined4 *)((long)in_RDI + 0xd4) = 500;
  *(undefined4 *)((long)in_RDI + 0xcc) = 1000;
  *(undefined4 *)((long)in_RDI + 0x6c) = 0;
  *(undefined4 *)((long)in_RDI + 0xbc) = 0;
  *(undefined4 *)(in_RDI + 0x18) = 0x3f;
  *(undefined4 *)(in_RDI + 0x12) = 1;
  *(undefined4 *)(in_RDI + 0xd) = 0;
  *(undefined4 *)(in_RDI + 0xc) = 0;
  local_10[0] = 0x4b000000258;
  testing::
  WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
  ::GetParam();
  p_Var4 = std::get<4ul,libaom_test::CodecFactory_const*,libaom_test::TestMode,int,unsigned_int,int>
                     ((tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
                       *)0x7de59c);
  *(undefined4 *)(in_RDI + 0x17) = *(undefined4 *)((long)local_10 + (long)*p_Var4 * 4);
  *(undefined4 *)((long)in_RDI + 0x3c) = 0x73a;
  *(undefined4 *)(in_RDI + 8) = 0x456;
  *(undefined4 *)(in_RDI + 9) = 0x73a;
  *(undefined4 *)((long)in_RDI + 0x4c) = 0x456;
  ResizingVideoSource::ResizingVideoSource
            ((ResizingVideoSource_conflict *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_stack_ffffffffffffff7c
             ,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
  (**(code **)(*in_RDI + 0x40))();
  *(undefined1 *)((long)in_RDI + 0x18bc) = 1;
  *(undefined4 *)((long)in_RDI + 0x18e4) = 1;
  *(undefined4 *)(in_RDI + 0x9e) = 3;
  *(undefined4 *)((long)in_RDI + 0x4f4) = 3;
  uVar5 = *(uint *)(in_RDI + 0x17) >> 3;
  *(int *)(in_RDI + 0x9f) = (int)(uVar5 * 0x32) / 100;
  *(int *)((long)in_RDI + 0x4fc) = (int)(uVar5 * 0x46) / 100;
  *(uint *)(in_RDI + 0xa0) = uVar5;
  uVar5 = (uint)((int)in_RDI[0x17] * 3) >> 3;
  *(int *)((long)in_RDI + 0x504) = (int)(uVar5 * 0x32) / 100;
  *(int *)(in_RDI + 0xa1) = (int)(uVar5 * 0x46) / 100;
  *(uint *)((long)in_RDI + 0x50c) = uVar5;
  uVar5 = *(uint *)(in_RDI + 0x17) >> 1 & 0x1fffffff;
  *(int *)(in_RDI + 0xa2) = (int)(uVar5 * 0x32) / 100;
  *(int *)((long)in_RDI + 0x514) = (int)(uVar5 * 0x46) / 100;
  *(uint *)(in_RDI + 0xa3) = uVar5;
  uVar2 = testing::internal::AlwaysTrue();
  if ((bool)uVar2) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper(in_stack_ffffffffffffff90)
    ;
    in_stack_ffffffffffffff66 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_ffffffffffffff66) {
      (**(code **)(in_RDI[3] + 0x10))(in_RDI + 3,local_48);
    }
    bVar3 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure
                      ((HasNewFatalFailureHelper *)&stack0xffffffffffffff88);
    if (bVar3) {
      iVar6 = 2;
    }
    else {
      iVar6 = 0;
    }
    uVar1 = CONCAT24(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
    in_stack_ffffffffffffff60 = iVar6;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffff66,uVar1))
              );
    if ((in_stack_ffffffffffffff60 == 0) ||
       (in_stack_ffffffffffffff84 = in_stack_ffffffffffffff60, in_stack_ffffffffffffff60 != 2))
    goto LAB_007de8be;
  }
  testing::Message::Message((Message *)in_stack_ffffffffffffff90);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
             (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff7c,
             (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)
             CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffff66,
                                     CONCAT24(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)))
            );
  testing::Message::~Message((Message *)0x7de878);
LAB_007de8be:
  ResizingVideoSource::~ResizingVideoSource((ResizingVideoSource_conflict *)0x7de8c8);
  return;
}

Assistant:

virtual void BasicRateTargetingSVC3TL3SLExternalResizePattern1HighResTest() {
    cfg_.rc_buf_initial_sz = 500;
    cfg_.rc_buf_optimal_sz = 500;
    cfg_.rc_buf_sz = 1000;
    cfg_.rc_dropframe_thresh = 0;
    cfg_.rc_min_quantizer = 0;
    cfg_.rc_max_quantizer = 63;
    cfg_.rc_end_usage = AOM_CBR;
    cfg_.g_lag_in_frames = 0;
    cfg_.g_error_resilient = 0;
    const int bitrate_array[2] = { 600, 1200 };
    cfg_.rc_target_bitrate = bitrate_array[GET_PARAM(4)];
    cfg_.g_w = 1850;
    cfg_.g_h = 1110;
    cfg_.g_forced_max_frame_width = 1850;
    cfg_.g_forced_max_frame_height = 1110;
    ResizingVideoSource video(1, 1850, 1110);
    ResetModel();
    external_resize_dynamic_drop_layer_ = true;
    external_resize_pattern_ = 1;
    number_temporal_layers_ = 3;
    number_spatial_layers_ = 3;
    // SL0
    const int bitrate_sl0 = 1 * cfg_.rc_target_bitrate / 8;
    target_layer_bitrate_[0] = 50 * bitrate_sl0 / 100;
    target_layer_bitrate_[1] = 70 * bitrate_sl0 / 100;
    target_layer_bitrate_[2] = bitrate_sl0;
    // SL1
    const int bitrate_sl1 = 3 * cfg_.rc_target_bitrate / 8;
    target_layer_bitrate_[3] = 50 * bitrate_sl1 / 100;
    target_layer_bitrate_[4] = 70 * bitrate_sl1 / 100;
    target_layer_bitrate_[5] = bitrate_sl1;
    // SL2
    const int bitrate_sl2 = 4 * cfg_.rc_target_bitrate / 8;
    target_layer_bitrate_[6] = 50 * bitrate_sl2 / 100;
    target_layer_bitrate_[7] = 70 * bitrate_sl2 / 100;
    target_layer_bitrate_[8] = bitrate_sl2;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
  }